

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

tlc_linecount_t
TURBOLINECOUNT::CLineCount::LineCount(TCHAR *filename,tlc_error_t *error,tlc_string_t *errorstring)

{
  bool bVar1;
  uint uVar2;
  tlc_error_t tVar3;
  int __oflag;
  tlc_string_t local_110;
  TCHAR *local_f0;
  tlc_linecount_t count;
  tlc_string_t local_e0;
  undefined1 local_b0 [8];
  CLineCount lc;
  tlc_string_t *errorstring_local;
  tlc_error_t *error_local;
  TCHAR *filename_local;
  
  lc._128_8_ = errorstring;
  CLineCount((CLineCount *)local_b0,(PARAMETERS *)0x0);
  uVar2 = open((CLineCount *)local_b0,filename,__oflag);
  if ((uVar2 & 1) == 0) {
    if (error != (tlc_error_t *)0x0) {
      tVar3 = lastError((CLineCount *)local_b0);
      *error = tVar3;
    }
    if (lc._128_8_ != 0) {
      lastErrorString_abi_cxx11_(&local_e0,(CLineCount *)local_b0);
      std::__cxx11::string::operator=((string *)lc._128_8_,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    filename_local = (TCHAR *)0xffffffffffffffff;
  }
  else {
    bVar1 = countLines((CLineCount *)local_b0,(tlc_linecount_t *)&local_f0);
    if (bVar1) {
      *error = 0;
      std::__cxx11::string::operator=((string *)lc._128_8_,"");
      filename_local = local_f0;
    }
    else {
      if (error != (tlc_error_t *)0x0) {
        tVar3 = lastError((CLineCount *)local_b0);
        *error = tVar3;
      }
      if (lc._128_8_ != 0) {
        lastErrorString_abi_cxx11_(&local_110,(CLineCount *)local_b0);
        std::__cxx11::string::operator=((string *)lc._128_8_,(string *)&local_110);
        std::__cxx11::string::~string((string *)&local_110);
      }
      filename_local = (TCHAR *)0xffffffffffffffff;
    }
  }
  count._4_4_ = 1;
  ~CLineCount((CLineCount *)local_b0);
  return (tlc_linecount_t)filename_local;
}

Assistant:

tlc_linecount_t CLineCount::LineCount(const TCHAR *filename, tlc_error_t * error, tlc_string_t *errorstring)
{
	CLineCount lc;
	if (!lc.open(filename))
	{
		if (error)
		{
			*error = lc.lastError();
		}
		if (errorstring)
		{
			*errorstring = lc.lastErrorString();
		}

		return -1;
	}

	tlc_linecount_t count;
	if (!lc.countLines(count))
	{
		if (error)
		{
			*error = lc.lastError();
		}
		if (errorstring)
		{
			*errorstring = lc.lastErrorString();
		}
		return -1;
	}

	*error = 0;
	*errorstring = _T("");

	return count;
}